

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

void extend_palette_color_map
               (uint8_t *color_map,int orig_width,int orig_height,int new_width,int new_height)

{
  uint8_t *puVar1;
  long lVar2;
  uint8_t *__src;
  size_t __n;
  size_t __n_00;
  
  if (new_height != orig_height || new_width != orig_width) {
    __n_00 = (size_t)orig_width;
    lVar2 = (long)(orig_height + -1);
    __n = (size_t)new_width;
    puVar1 = color_map + __n * lVar2;
    __src = color_map + __n_00 * lVar2;
    for (; -1 < lVar2; lVar2 = lVar2 + -1) {
      memmove(puVar1,__src,__n_00);
      memset(puVar1 + __n_00,(uint)puVar1[__n_00 - 1],(long)(new_width - orig_width));
      puVar1 = puVar1 + -__n;
      __src = __src + -__n_00;
    }
    lVar2 = (long)orig_height;
    puVar1 = color_map + __n * lVar2;
    for (; lVar2 < new_height; lVar2 = lVar2 + 1) {
      memcpy(puVar1,color_map + (orig_height + -1) * new_width,__n);
      puVar1 = puVar1 + __n;
    }
  }
  return;
}

Assistant:

static inline void extend_palette_color_map(uint8_t *const color_map,
                                            int orig_width, int orig_height,
                                            int new_width, int new_height) {
  int j;
  assert(new_width >= orig_width);
  assert(new_height >= orig_height);
  if (new_width == orig_width && new_height == orig_height) return;

  for (j = orig_height - 1; j >= 0; --j) {
    memmove(color_map + j * new_width, color_map + j * orig_width, orig_width);
    // Copy last column to extra columns.
    memset(color_map + j * new_width + orig_width,
           color_map[j * new_width + orig_width - 1], new_width - orig_width);
  }
  // Copy last row to extra rows.
  for (j = orig_height; j < new_height; ++j) {
    memcpy(color_map + j * new_width, color_map + (orig_height - 1) * new_width,
           new_width);
  }
}